

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O0

SUNErrCode SUNNonlinSolInitialize(SUNNonlinearSolver NLS)

{
  long in_RDI;
  SUNErrCode ier;
  undefined4 local_c;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 8) == 0) {
    local_c = 0;
  }
  else {
    local_c = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI);
  }
  return local_c;
}

Assistant:

SUNErrCode SUNNonlinSolInitialize(SUNNonlinearSolver NLS)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(NLS));
  if (NLS->ops->initialize) { ier = NLS->ops->initialize(NLS); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(NLS));
  return (ier);
}